

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          RayTracingPipelineStateCreateInfo *CreateInfo)

{
  bool bVar1;
  PSO_CREATE_FLAGS PVar2;
  IThreadPool *pIVar3;
  iterator __first;
  iterator __last;
  reference ppSVar4;
  anon_class_552_3_1ef41722_for_Handler local_338;
  undefined1 local_110 [8];
  undefined1 local_108 [8];
  RefCntAutoPtr<Diligent::IAsyncTask> pCompileTask;
  ShaderVkImpl *pShader;
  iterator __end0_1;
  iterator __begin0_1;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
  *__range4_1;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  ShaderCompileTasks;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
  StageShaders;
  ShaderStageInfo *Stage;
  iterator __end0;
  iterator __begin0;
  TShaderStages *__range4;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> Shaders;
  SHADER_TYPE local_3c;
  undefined1 local_38 [3];
  bool WaitUntilShadersReady;
  SHADER_TYPE ActiveShaderStages;
  TShaderStages ShaderStages;
  PipelineStateImplType *pThisImpl;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  ShaderStages.
  super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::atomic<Diligent::PIPELINE_STATE_STATUS>::store
            (&this->m_Status,PIPELINE_STATE_STATUS_COMPILING,memory_order_seq_cst);
  PVar2 = Diligent::operator&((CreateInfo->super_PipelineStateCreateInfo).Flags,
                              PSO_CREATE_FLAG_ASYNCHRONOUS);
  if ((PVar2 == PSO_CREATE_FLAG_NONE) ||
     (pIVar3 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetShaderCompilationThreadPool
                         ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)
                          (this->
                          super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                          ).m_pDevice), pIVar3 == (IThreadPool *)0x0)) {
    PipelineStateVkImpl::InitializePipeline
              ((PipelineStateVkImpl *)
               ShaderStages.
               super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,CreateInfo);
    std::atomic<Diligent::PIPELINE_STATE_STATUS>::store
              (&this->m_Status,PIPELINE_STATE_STATUS_READY,memory_order_seq_cst);
  }
  else {
    std::
    vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
    ::vector((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
              *)local_38);
    local_3c = SHADER_TYPE_UNKNOWN;
    PipelineStateUtils::
    ExtractShaders<Diligent::ShaderVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
              (CreateInfo,
               (vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                *)local_38,false,&local_3c);
    std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    vector((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
            *)&__range4);
    __end0 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::begin((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                      *)local_38);
    Stage = (ShaderStageInfo *)
            std::
            vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
            ::end((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                   *)local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Diligent::PipelineStateVkImpl::ShaderStageInfo_*,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
                                       *)&Stage), bVar1) {
      StageShaders.
      super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<Diligent::PipelineStateVkImpl::ShaderStageInfo_*,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
                    ::operator*(&__end0);
      GetStageShaders((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                       *)local_a0,
                      (ShaderStageInfo *)
                      StageShaders.
                      super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_b0._0_8_ =
           std::
           vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
           end((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                *)&__range4);
      __gnu_cxx::
      __normal_iterator<Diligent::ShaderVkImpl_const*const*,std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>>
      ::__normal_iterator<Diligent::ShaderVkImpl_const**>
                ((__normal_iterator<Diligent::ShaderVkImpl_const*const*,std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>>
                  *)(local_b0 + 8),
                 (__normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                  *)local_b0);
      __first = std::
                vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                ::begin((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                         *)local_a0);
      __last = std::
               vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               ::end((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                      *)local_a0);
      ShaderCompileTasks.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>
                    ::
                    insert<__gnu_cxx::__normal_iterator<Diligent::ShaderVkImpl_const**,std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>>,void>
                              ((vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>
                                *)&__range4,(const_iterator)local_b0._8_8_,
                               (__normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                                )__first._M_current,
                               (__normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                                )__last._M_current);
      std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
      ~vector((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               *)local_a0);
      __gnu_cxx::
      __normal_iterator<Diligent::PipelineStateVkImpl::ShaderStageInfo_*,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
      ::operator++(&__end0);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::vector((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
              *)&__range4_1);
    __end0_1 = std::
               vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               ::begin((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                        *)&__range4);
    pShader = (ShaderVkImpl *)
              std::
              vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
              ::end((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                     *)&__range4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                               *)&pShader), bVar1) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                ::operator*(&__end0_1);
      pCompileTask.m_pObject = (IAsyncTask *)*ppSVar4;
      ShaderBase<Diligent::EngineVkImplTraits>::GetCompileTask
                ((ShaderBase<Diligent::EngineVkImplTraits> *)local_108);
      bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)local_108);
      if (bVar1) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
        ::emplace_back<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                    *)&__range4_1,(RefCntAutoPtr<Diligent::IAsyncTask> *)local_108);
      }
      RefCntAutoPtr<Diligent::IAsyncTask>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IAsyncTask> *)local_108);
      __gnu_cxx::
      __normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
      ::operator++(&__end0_1);
    }
    pIVar3 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetShaderCompilationThreadPool
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)
                        (this->
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        ).m_pDevice);
    local_338.pThisImpl =
         (PipelineStateImplType *)
         ShaderStages.
         super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    vector(&local_338.Shaders,
           (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
            *)&__range4);
    RayTracingPipelineStateCreateInfoX::RayTracingPipelineStateCreateInfoX
              (&local_338.CreateInfo,CreateInfo);
    AsyncInitializer::
    Start<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>(Diligent::RayTracingPipelineStateCreateInfo_const&)::_lambda(unsigned_int)_1_>
              ((AsyncInitializer *)local_110,pIVar3,
               (vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                *)&__range4_1,&local_338);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    operator=(&this->m_AsyncInitializer,
              (unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
               *)local_110);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)local_110);
    Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>(Diligent::RayTracingPipelineStateCreateInfo_const&)
    ::{lambda(unsigned_int)#1}::~Construct((_lambda_unsigned_int__1_ *)&local_338);
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::~vector((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
               *)&__range4_1);
    std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    ~vector((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
             *)&__range4);
    std::
    vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
    ::~vector((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               *)local_38);
  }
  return;
}

Assistant:

void Construct(const PSOCreateInfoType& CreateInfo)
    {
        PipelineStateImplType* const pThisImpl = static_cast<PipelineStateImplType*>(this);

        m_Status.store(PIPELINE_STATE_STATUS_COMPILING);
        if ((CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0 && this->m_pDevice->GetShaderCompilationThreadPool() != nullptr)
        {
            // Collect all asynchronous shader compile tasks
            typename PipelineStateImplType::TShaderStages ShaderStages;
            SHADER_TYPE                                   ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
            constexpr bool                                WaitUntilShadersReady = false;
            PipelineStateUtils::ExtractShaders<ShaderImplType>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

            std::vector<const ShaderImplType*> Shaders;
            for (const auto& Stage : ShaderStages)
            {
                std::vector<const ShaderImplType*> StageShaders = GetStageShaders(Stage);
                Shaders.insert(Shaders.end(), StageShaders.begin(), StageShaders.end());
            }

            std::vector<RefCntAutoPtr<IAsyncTask>> ShaderCompileTasks;
            for (const ShaderImplType* pShader : Shaders)
            {
                if (RefCntAutoPtr<IAsyncTask> pCompileTask = pShader->GetCompileTask())
                    ShaderCompileTasks.emplace_back(std::move(pCompileTask));
            }

            m_AsyncInitializer = AsyncInitializer::Start(
                this->m_pDevice->GetShaderCompilationThreadPool(),
                ShaderCompileTasks, // Make sure that all asynchronous shader compile tasks are completed first
                [pThisImpl,
#ifdef DILIGENT_DEBUG
                 Shaders,
#endif
                 CreateInfo = typename PipelineStateCreateInfoXTraits<PSOCreateInfoType>::CreateInfoXType{CreateInfo}](Uint32 ThreadId) mutable //
                {
#ifdef DILIGENT_DEBUG
                    for (const ShaderImplType* pShader : Shaders)
                    {
                        VERIFY(!pShader->IsCompiling(), "All shader compile tasks must have been completed since we used them as "
                                                        "prerequisites for the pipeline initialization task. This appears to be a bug.");
                    }
#endif
                    try
                    {
                        pThisImpl->InitializePipeline(CreateInfo);
                        pThisImpl->m_Status.store(PIPELINE_STATE_STATUS_READY);
                    }
                    catch (...)
                    {
                        pThisImpl->m_Status.store(PIPELINE_STATE_STATUS_FAILED);
                    }

                    // Release create info objects
                    CreateInfo.Clear();
                });
        }
        else
        {
            try
            {
                pThisImpl->InitializePipeline(CreateInfo);
                m_Status.store(PIPELINE_STATE_STATUS_READY);
            }
            catch (...)
            {
                pThisImpl->Destruct();
                throw;
            }
        }
    }